

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlOutputBufferPtr xmlAllocOutputBuffer(xmlCharEncodingHandlerPtr encoder)

{
  xmlBufPtr pxVar1;
  xmlOutputBufferPtr ret;
  xmlCharEncodingHandlerPtr encoder_local;
  
  encoder_local = (xmlCharEncodingHandlerPtr)(*xmlMalloc)(0x38);
  if (encoder_local == (xmlCharEncodingHandlerPtr)0x0) {
    xmlCharEncCloseFunc(encoder);
    encoder_local = (xmlCharEncodingHandlerPtr)0x0;
  }
  else {
    memset(encoder_local,0,0x38);
    pxVar1 = xmlBufCreate(4000);
    encoder_local->iconv_out = pxVar1;
    if ((xmlBufPtr)encoder_local->iconv_out == (xmlBufPtr)0x0) {
      xmlCharEncCloseFunc(encoder);
      (*xmlFree)(encoder_local);
      encoder_local = (xmlCharEncodingHandlerPtr)0x0;
    }
    else {
      encoder_local->iconv_in = encoder;
      if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
        encoder_local->inputCtxt = (xmlBufPtr)0x0;
      }
      else {
        pxVar1 = xmlBufCreate(4000);
        encoder_local->inputCtxt = pxVar1;
        if ((xmlBufPtr)encoder_local->inputCtxt == (xmlBufPtr)0x0) {
          xmlOutputBufferClose((xmlOutputBufferPtr)encoder_local);
          return (xmlOutputBufferPtr)0x0;
        }
        xmlCharEncOutput((xmlOutputBufferPtr)encoder_local,1);
      }
      encoder_local->input = (xmlCharEncodingInputFunc)0x0;
      encoder_local->output = (xmlCharEncodingOutputFunc)0x0;
      encoder_local->name = (char *)0x0;
      *(int *)&encoder_local->outputCtxt = 0;
    }
  }
  return (xmlOutputBufferPtr)encoder_local;
}

Assistant:

xmlOutputBufferPtr
xmlAllocOutputBuffer(xmlCharEncodingHandlerPtr encoder) {
    xmlOutputBufferPtr ret;

    ret = (xmlOutputBufferPtr) xmlMalloc(sizeof(xmlOutputBuffer));
    if (ret == NULL) {
        xmlCharEncCloseFunc(encoder);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlOutputBuffer));
    ret->buffer = xmlBufCreate(MINLEN);
    if (ret->buffer == NULL) {
        xmlCharEncCloseFunc(encoder);
        xmlFree(ret);
	return(NULL);
    }

    ret->encoder = encoder;
    if (encoder != NULL) {
        ret->conv = xmlBufCreate(MINLEN);
	if (ret->conv == NULL) {
            xmlOutputBufferClose(ret);
	    return(NULL);
	}

	/*
	 * This call is designed to initiate the encoder state
	 */
	xmlCharEncOutput(ret, 1);
    } else
        ret->conv = NULL;
    ret->writecallback = NULL;
    ret->closecallback = NULL;
    ret->context = NULL;
    ret->written = 0;

    return(ret);
}